

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqbaselib.cpp
# Opt level: O0

SQInteger base_type(HSQUIRRELVM v)

{
  SQString *x;
  SQVM *in_RDI;
  SQObjectPtr *o;
  SQInteger in_stack_ffffffffffffffb8;
  SQSharedState *o_00;
  HSQUIRRELVM in_stack_ffffffffffffffc0;
  SQChar *in_stack_ffffffffffffffc8;
  SQSharedState *in_stack_ffffffffffffffd0;
  SQObjectPtr local_20;
  SQObjectPtr *local_10;
  SQVM *local_8;
  
  local_8 = in_RDI;
  local_10 = stack_get(in_stack_ffffffffffffffc0,in_stack_ffffffffffffffb8);
  o_00 = local_8->_sharedstate;
  GetTypeName((SQObjectPtr *)0x143a6c);
  x = SQString::Create(in_stack_ffffffffffffffd0,in_stack_ffffffffffffffc8,(SQInteger)local_8);
  SQObjectPtr::SQObjectPtr(&local_20,x);
  SQVM::Push(local_8,(SQObjectPtr *)o_00);
  SQObjectPtr::~SQObjectPtr((SQObjectPtr *)local_8);
  return 1;
}

Assistant:

static SQInteger base_type(HSQUIRRELVM v)
{
    SQObjectPtr &o = stack_get(v,2);
    v->Push(SQString::Create(_ss(v),GetTypeName(o),-1));
    return 1;
}